

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnSimdShuffleOpExpr
          (BinaryReaderInterp *this,Opcode opcode,v128 value)

{
  Result RVar1;
  Location loc;
  Location local_48;
  
  local_48.field_1.field_0.last_column = 0;
  local_48.filename._M_len = (this->filename_)._M_len;
  local_48.filename._M_str = (this->filename_)._M_str;
  local_48.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar1 = SharedValidator::OnSimdShuffleOp(&this->validator_,&local_48,opcode,value);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,opcode.enum_,value);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnSimdShuffleOpExpr(Opcode opcode, v128 value) {
  CHECK_RESULT(validator_.OnSimdShuffleOp(GetLocation(), opcode, value));
  istream_.Emit(opcode, value);
  return Result::Ok;
}